

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

void __thiscall
Js::JavascriptProxy::JavascriptProxy
          (JavascriptProxy *this,DynamicType *type,ScriptContext *scriptContext,
          RecyclableObject *target,RecyclableObject *handler)

{
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_013cc140;
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet(&this->handler,handler);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet(&this->target,target);
  Js::Type::SetHasSpecialPrototype(&type->super_Type,true);
  return;
}

Assistant:

JavascriptProxy::JavascriptProxy(DynamicType * type, ScriptContext * scriptContext, RecyclableObject* target, RecyclableObject* handler) :
        DynamicObject(type),
        handler(handler),
        target(target)
    {
        type->SetHasSpecialPrototype(true);
    }